

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.h
# Opt level: O3

vbignum_t * __thiscall vbignum_t::operator%(vbignum_t *this,vbignum_t *b)

{
  ushort uVar1;
  ushort *ext1;
  ushort *ext2;
  vbignum_t *pvVar2;
  ushort *new_rem_ext;
  char *new_ext;
  ushort uVar3;
  uint16_t tmp;
  
  pvVar2 = (vbignum_t *)operator_new(8);
  ext1 = (ushort *)this->ext_;
  uVar1 = *ext1;
  ext2 = (ushort *)b->ext_;
  uVar3 = *ext2;
  if (uVar3 < uVar1) {
    uVar3 = uVar1;
  }
  new_rem_ext = (ushort *)operator_new__((ulong)(uVar3 + 1 >> 1) + 5);
  pvVar2->ext_ = (char *)new_rem_ext;
  *new_rem_ext = uVar3;
  *(char *)(new_rem_ext + 2) = '\0';
  new_ext = (char *)operator_new__(6);
  new_ext[0] = '\x02';
  new_ext[1] = '\0';
  new_ext[4] = '\0';
  CVmObjBigNum::compute_quotient_into(new_ext,(char *)new_rem_ext,(char *)ext1,(char *)ext2);
  operator_delete__(new_ext);
  return pvVar2;
}

Assistant:

vbignum_t *operator %(const vbignum_t &b) const
    {
        vbignum_t *res = new vbignum_t(), quo;
        res->init(maxprec(this, &b));
        quo.init(2);
        CVmObjBigNum::compute_quotient_into(quo.ext_, res->ext_, ext_, b.ext_);
        return res;
    }